

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O2

void __thiscall mario::EPoller::update(EPoller *this,int operation,Channel *channel)

{
  int iVar1;
  Writer *pWVar2;
  int fd;
  int operation_local;
  undefined1 local_8c [12];
  Writer local_80;
  
  local_8c._0_4_ = channel->_events;
  fd = channel->_fd;
  operation_local = operation;
  local_8c._4_8_ = channel;
  iVar1 = epoll_ctl(this->_epollfd,operation,fd,(epoll_event *)local_8c);
  if (iVar1 < 0) {
    local_80._vptr_Writer = (_func_int **)&PTR__Writer_0012be20;
    local_80.m_msg = (LogMessage *)0x0;
    local_80.m_level = Fatal;
    local_80.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EPoller.cpp"
    ;
    local_80.m_line = 99;
    local_80.m_func = "void mario::EPoller::update(int, Channel *)";
    local_80.m_verboseLevel = 0;
    local_80.m_logger = (Logger *)0x0;
    local_80.m_proceed = false;
    local_80.m_messageBuilder.m_logger = (Logger *)0x0;
    local_80.m_messageBuilder.m_containerLogSeperator = "";
    local_80.m_dispatchAction = NormalLog;
    local_80.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_80.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar2 = el::base::Writer::construct(&local_80,1,"default");
    pWVar2 = el::base::Writer::operator<<(pWVar2,(char (*) [16])"epoll_ctl op = ");
    pWVar2 = el::base::Writer::operator<<(pWVar2,&operation_local);
    pWVar2 = el::base::Writer::operator<<(pWVar2,(char (*) [7])" fd = ");
    el::base::Writer::operator<<(pWVar2,&fd);
    el::base::Writer::~Writer(&local_80);
  }
  return;
}

Assistant:

void EPoller::update(int operation, Channel* channel) {
    struct epoll_event event;
    bzero(&event, sizeof(event));
    event.events = channel->events();
    event.data.ptr = channel;
    int fd = channel->fd();
    if (::epoll_ctl(_epollfd, operation, fd, &event) < 0) {
        LOG(FATAL) << "epoll_ctl op = " << operation << " fd = " << fd;
    }
}